

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::SetSectionNote(FConfigFile *this,char *section,char *note)

{
  FConfigSection *section_00;
  
  section_00 = FindSection(this,section);
  SetSectionNote(this,section_00,note);
  return;
}

Assistant:

void FConfigFile::SetSectionNote(const char *section, const char *note)
{
	SetSectionNote(FindSection(section), note);
}